

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x16.cxx
# Opt level: O0

OledPoint SSD1306::drawChar8x16(OledPoint *p,uint8_t c,PixelStyle style,OledPixel *oled)

{
  byte bVar1;
  OledPoint p_00;
  OledPoint p_01;
  int iVar2;
  int iVar3;
  int iVar4;
  PixelStyle in_EDX;
  byte in_SIL;
  Point<int> *in_RDI;
  int16_t i;
  uint8_t byte;
  int16_t j;
  PixelStyle opposite;
  PixelStyle in_stack_ffffffffffffffc4;
  OledPixel *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  short sVar5;
  short local_26;
  OledPoint local_8;
  
  oppositeStyle(in_EDX);
  for (local_26 = 0; local_26 < 0x10; local_26 = local_26 + 1) {
    bVar1 = font8x16[(long)local_26 + (ulong)in_SIL * 0x10];
    if (bVar1 != 0) {
      for (sVar5 = 0; sVar5 < 8; sVar5 = sVar5 + 1) {
        if (((int)(uint)bVar1 >> (7U - (char)sVar5 & 0x1f) & 1U) == 0) {
          iVar2 = Point<int>::x(in_RDI);
          iVar4 = (int)sVar5;
          iVar3 = Point<int>::y(in_RDI);
          Point<int>::Point((Point<int> *)&stack0xffffffffffffffc4,iVar2 + iVar4,iVar3 + local_26);
          p_01.m_y._2_2_ = sVar5;
          p_01._0_6_ = in_stack_ffffffffffffffd0;
          OledPixel::pixel(in_stack_ffffffffffffffc8,p_01,in_stack_ffffffffffffffc4);
        }
        else {
          iVar2 = Point<int>::x(in_RDI);
          iVar4 = (int)sVar5;
          iVar3 = Point<int>::y(in_RDI);
          Point<int>::Point((Point<int> *)&stack0xffffffffffffffcc,iVar2 + iVar4,iVar3 + local_26);
          p_00.m_y._2_2_ = sVar5;
          p_00._0_6_ = in_stack_ffffffffffffffd0;
          OledPixel::pixel(in_stack_ffffffffffffffc8,p_00,in_stack_ffffffffffffffc4);
        }
      }
    }
  }
  iVar2 = Point<int>::x(in_RDI);
  iVar3 = Point<int>::y(in_RDI);
  Point<int>::Point(&local_8,iVar2 + 8,iVar3);
  return local_8;
}

Assistant:

SSD1306::OledPoint
SSD1306::drawChar8x16(
    const OledPoint& p,
    uint8_t c,
    PixelStyle style,
    OledPixel& oled)
{
    PixelStyle opposite = oppositeStyle(style);

    for (int16_t j = 0 ; j < sc_fontHeight8x16 ; ++j)
    {
        uint8_t byte = font8x16[c][j];

        if (byte != 0)
        {
            for (int16_t i = 0 ; i < sc_fontWidth8x16 ; ++i)
            {
                if ((byte >> (sc_fontWidth8x16 - i - 1)) & 1 )
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), style);
                }
                else
                {
                    oled.pixel(OledPoint(p.x() + i, p.y() + j), opposite);
                }
            }
        }
    }

    return OledPoint(p.x() + sc_fontWidth8x16, p.y());
}